

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O2

void __thiscall
soplex::
DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
::DataArray(DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
            *this,DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                  *old)

{
  int n;
  
  this->thesize = old->thesize;
  n = old->themax;
  this->themax = n;
  this->data = (Status *)0x0;
  this->memFactor = old->memFactor;
  spx_alloc<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Desc::Status*>
            (&this->data,n);
  if ((ulong)(uint)this->thesize != 0) {
    memcpy(this->data,old->data,(ulong)(uint)this->thesize << 2);
    return;
  }
  return;
}

Assistant:

DataArray(const DataArray& old)
      : thesize(old.thesize)
      , themax(old.themax)
      , data(nullptr)
      , memFactor(old.memFactor)
   {
      spx_alloc(data, max());

      assert(thesize >= 0);

      if(thesize)
         memcpy(data, old.data, (unsigned int)thesize * sizeof(T));

      assert(isConsistent());
   }